

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringOpt.cpp
# Opt level: O3

void sznet::sz_split(string *s,
                    vector<sznet::StringPiece,_std::allocator<sznet::StringPiece>_> *tokens,
                    string *delimiters)

{
  ulong uVar1;
  ulong uVar2;
  pointer pcVar3;
  pointer local_40;
  int local_34;
  
  pcVar3 = (delimiters->_M_dataplus)._M_p;
  uVar2 = 0;
  while( true ) {
    uVar1 = std::__cxx11::string::find_first_not_of((char *)s,(ulong)pcVar3,uVar2);
    uVar2 = std::__cxx11::string::find_first_of
                      ((char *)s,(ulong)(delimiters->_M_dataplus)._M_p,uVar1);
    if ((uVar2 & uVar1) == 0xffffffffffffffff) break;
    local_34 = (int)uVar2;
    if (uVar2 == 0xffffffffffffffff) {
      local_34 = (int)s->_M_string_length;
    }
    local_34 = local_34 - (int)uVar1;
    local_40 = (s->_M_dataplus)._M_p + uVar1;
    std::vector<sznet::StringPiece,std::allocator<sznet::StringPiece>>::
    emplace_back<char_const*,int>
              ((vector<sznet::StringPiece,std::allocator<sznet::StringPiece>> *)tokens,&local_40,
               &local_34);
    pcVar3 = (delimiters->_M_dataplus)._M_p;
  }
  return;
}

Assistant:

void sz_split(const sznet::string& s, std::vector<sznet::StringPiece>& tokens, const sznet::string& delimiters)
{
	sznet::string::size_type beginPos = s.find_first_not_of(delimiters, 0);
	sznet::string::size_type endPos = s.find_first_of(delimiters, beginPos);
	size_t size = 0;
	while (sznet::string::npos != endPos || sznet::string::npos != beginPos)
	{
		size = endPos - beginPos;
		if (endPos == sznet::string::npos)
		{
			size = s.size() - beginPos;
		}
		// assert(size <= std::numeric_limits<int>::max());
		tokens.emplace_back(s.data() + beginPos, static_cast<int>(size));
		beginPos = s.find_first_not_of(delimiters, endPos);
		endPos = s.find_first_of(delimiters, beginPos);
	}
}